

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

__m256i * convolve_lowbd_x(__m256i *__return_storage_ptr__,__m256i data,__m256i *coeffs,
                          __m256i *filt)

{
  __m256i *palVar1;
  undefined1 auVar2 [32];
  undefined1 in_ZMM0 [64];
  __m256i local_c0;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  auVar2 = in_ZMM0._0_32_;
  local_c0 = (__m256i)vpshufb_avx2(auVar2,(undefined1  [32])*coeffs);
  local_a0 = vpshufb_avx2(auVar2,(undefined1  [32])coeffs[1]);
  local_80 = vpshufb_avx2(auVar2,(undefined1  [32])coeffs[2]);
  local_60 = vpshufb_avx2(auVar2,(undefined1  [32])coeffs[3]);
  palVar1 = convolve_lowbd(&local_c0,__return_storage_ptr__);
  return palVar1;
}

Assistant:

static inline __m256i convolve_lowbd_x(const __m256i data,
                                       const __m256i *const coeffs,
                                       const __m256i *const filt) {
  __m256i s[4];

  s[0] = _mm256_shuffle_epi8(data, filt[0]);
  s[1] = _mm256_shuffle_epi8(data, filt[1]);
  s[2] = _mm256_shuffle_epi8(data, filt[2]);
  s[3] = _mm256_shuffle_epi8(data, filt[3]);

  return convolve_lowbd(s, coeffs);
}